

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O0

void __thiscall Fl_Tree_Item_Array::insert(Fl_Tree_Item_Array *this,int pos,Fl_Tree_Item *new_item)

{
  int nitems;
  Fl_Tree_Item *new_item_local;
  int pos_local;
  Fl_Tree_Item_Array *this_local;
  
  enlarge(this,1);
  if (pos <= this->_total + -1) {
    memmove(this->_items + (pos + 1),this->_items + pos,(long)(this->_total - pos) << 3);
  }
  this->_items[pos] = new_item;
  this->_total = this->_total + 1;
  Fl_Tree_Item::update_prev_next(this->_items[pos],pos);
  return;
}

Assistant:

void Fl_Tree_Item_Array::insert(int pos, Fl_Tree_Item *new_item) {
  enlarge(1);
  // printf("*** POS=%d TOTAL-1=%d NITEMS=%d\n", pos, _total-1, (_total-pos));
  if ( pos <= (_total - 1) ) {	// need to move memory around?
    int nitems = _total - pos;
    memmove(&_items[pos+1], &_items[pos], sizeof(Fl_Tree_Item*) * nitems);
  } 
  _items[pos] = new_item;
  _total++;
#if FLTK_ABI_VERSION >= 10303
  if ( _flags & MANAGE_ITEM )
#endif
  {
    _items[pos]->update_prev_next(pos);	// adjust item's prev/next and its neighbors
  }
}